

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void impl_ARB1_UseProgram(MOJOSHADER_glProgram *program)

{
  GLuint local_18;
  GLuint local_14;
  GLuint phandle;
  GLuint vhandle;
  MOJOSHADER_glProgram *program_local;
  
  local_14 = 0;
  local_18 = 0;
  if (program != (MOJOSHADER_glProgram *)0x0) {
    if (program->vertex != (MOJOSHADER_glShader *)0x0) {
      local_14 = program->vertex->handle;
    }
    if (program->fragment != (MOJOSHADER_glShader *)0x0) {
      local_18 = program->fragment->handle;
    }
  }
  toggle_gl_state(0x8620,(uint)(local_14 != 0));
  toggle_gl_state(0x8804,(uint)(local_18 != 0));
  (*ctx->glBindProgramARB)(0x8620,local_14);
  (*ctx->glBindProgramARB)(0x8804,local_18);
  return;
}

Assistant:

static void impl_ARB1_UseProgram(MOJOSHADER_glProgram *program)
{
    GLuint vhandle = 0;
    GLuint phandle = 0;
    if (program != NULL)
    {
        if (program->vertex != NULL)
            vhandle = program->vertex->handle;
        if (program->fragment != NULL)
            phandle = program->fragment->handle;
    } // if

    toggle_gl_state(GL_VERTEX_PROGRAM_ARB, vhandle != 0);
    toggle_gl_state(GL_FRAGMENT_PROGRAM_ARB, phandle != 0);

    ctx->glBindProgramARB(GL_VERTEX_PROGRAM_ARB, vhandle);
    ctx->glBindProgramARB(GL_FRAGMENT_PROGRAM_ARB, phandle);
}